

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

TRef crec_ct_tv(jit_State *J,CType *d,TRef dp,TRef sp,cTValue *sval)

{
  uint k;
  CTSize CVar1;
  ushort uVar2;
  byte bVar3;
  ushort uVar4;
  IRRef1 IVar5;
  IRType IVar6;
  IRType IVar7;
  IRType IVar8;
  TRef TVar9;
  uint uVar10;
  TRef TVar11;
  ulong uVar12;
  cTValue *pcVar13;
  CType *pCVar14;
  GCcdata *pGVar15;
  ushort uVar16;
  CType *ct;
  uint uVar17;
  IROp op;
  IRRef1 IVar18;
  CTState *pCVar19;
  IRRef1 IVar20;
  int32_t k_00;
  bool bVar22;
  bool bVar23;
  CTSize ofs;
  double *local_50;
  CTSize local_34;
  int32_t iVar21;
  
  pCVar19 = (CTState *)(ulong)J[-1].bpropcache[9].mode;
  uVar17 = sp >> 0x18 & 0x1f;
  if (uVar17 - 0xf < 5) {
    local_50 = (double *)(ulong)((sval->u64 & 0x7fffffffffffffff) != 0);
    uVar17 = 9;
LAB_00136ef4:
    ct = (CType *)((long)&pCVar19->tab->info + (ulong)(uVar17 << 4));
  }
  else {
    uVar10 = sp & 0x1f000000;
    if (uVar10 == 0xe000000) {
      local_50 = (double *)(ulong)((sval->u64 & 0x7fffffffffffffff) != 0);
      uVar17 = 0xe;
      goto LAB_00136ef4;
    }
    if (uVar17 - 1 < 2) {
      sp = lj_ir_kint(J,(uint)(uVar10 == 0x2000000));
      uVar17 = 3;
      local_50 = (double *)0x0;
      goto LAB_00136ef4;
    }
    IVar20 = (IRRef1)sp;
    if (uVar10 == 0xc000000) {
      if (*(char *)((ulong)(sval->u32).lo + 6) == '\x01') {
        (J->fold).ins.field_0.op1 = IVar20;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4310000a;
        TVar9 = lj_opt_fold(J);
        TVar11 = lj_ir_kint(J,1);
        (J->fold).ins.field_0.ot = 0x893;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
        lj_opt_fold(J);
        (J->fold).ins.field_0.op1 = IVar20;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4309000b;
        sp = lj_opt_fold(J);
        uVar17 = 0x11;
        local_50 = (double *)0x0;
      }
      else {
        TVar9 = lj_ir_kint64(J,0x18);
        (J->fold).ins.field_0.ot = 0x2809;
        (J->fold).ins.field_0.op1 = IVar20;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
        sp = lj_opt_fold(J);
        uVar17 = 0x11;
        local_50 = (double *)0x0;
      }
      goto LAB_00136ef4;
    }
    if (uVar10 == 0x4000000) {
      if ((d->info & 0xf0000000) == 0x50000000) {
        uVar17 = (sval->u32).lo;
        local_50 = (double *)0x0;
        pCVar14 = lj_ctype_getfieldq(pCVar19,d,&((GCobj *)(ulong)uVar17)->str,&local_34,
                                     (CTInfo *)0x0);
        TVar9 = lj_ir_kgc(J,(GCobj *)(ulong)uVar17,IRT_STR);
        (J->fold).ins.field_0.ot = 0x884;
        (J->fold).ins.field_0.op1 = IVar20;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
        lj_opt_fold(J);
        uVar17 = 0x11;
        if (pCVar14 != (CType *)0x0) {
          if ((pCVar14->info & 0xf0000000) == 0xb0000000) {
            local_50 = (double *)(ulong)(local_34 != 0);
            sp = lj_ir_kint(J,local_34);
            uVar17 = (uint)(ushort)pCVar14->info;
          }
          else {
            local_50 = (double *)0x0;
          }
        }
      }
      else {
        if ((d->info & 0xfc000000) == 0x30000000) {
          lj_trace_err(J,LJ_TRERR_BADTYPE);
        }
        TVar9 = lj_ir_kint64(J,0x10);
        (J->fold).ins.field_0.ot = 0x2809;
        (J->fold).ins.field_0.op1 = IVar20;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
        sp = lj_opt_fold(J);
        uVar17 = 0x14;
        local_50 = (double *)0x0;
      }
      goto LAB_00136ef4;
    }
    if (uVar10 == 0) {
      local_50 = (double *)0x0;
      sp = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
      uVar17 = 0x11;
      goto LAB_00136ef4;
    }
    pGVar15 = argv2cdata(J,sp,sval);
    pCVar14 = pCVar19->tab;
    uVar17 = pCVar14[pGVar15->ctypeid].info;
    ct = pCVar14 + pGVar15->ctypeid;
    local_50 = (double *)((ulong)(sval->u32).lo + 8);
    IVar7 = crec_ct2irt(pCVar19,ct);
    uVar10 = uVar17 >> 0x1c;
    uVar2 = (ushort)IVar7;
    if (uVar10 == 2) {
      (J->fold).ins.field_0.ot = uVar2 | 0x4300;
      (J->fold).ins.field_0.op1 = IVar20;
      (J->fold).ins.field_0.op2 = 0xd;
      sp = lj_opt_fold(J);
      if ((ct->info & 0xf0800000) == 0x20800000) {
        local_50 = (double *)*local_50;
        uVar12 = (ulong)((ct->info & 0xffff) << 4);
        uVar17 = *(uint *)((long)&pCVar19->tab->info + uVar12);
        if ((uVar17 & 0xf0000000) == 0x50000000) {
          uVar12 = (ulong)((uVar17 & 0xffff) << 4);
        }
        ct = (CType *)((long)&pCVar19->tab->info + uVar12);
        IVar7 = crec_ct2irt(pCVar19,ct);
LAB_00137a85:
        if ((ct->info < 0x10000000) && (IVar7 != IRT_CDATA)) {
          (J->fold).ins.field_0.ot = (ushort)IVar7 | 0x4400;
          (J->fold).ins.field_0.op1 = (IRRef1)sp;
          (J->fold).ins.field_0.op2 = 0;
          goto LAB_00137ab9;
        }
      }
    }
    else {
      if (IVar7 - IRT_I64 < 2) {
        (J->fold).ins.field_0.ot = uVar2 | 0x4300;
        (J->fold).ins.field_0.op1 = IVar20;
        (J->fold).ins.field_0.op2 = 0xf;
      }
      else {
        if (1 < IVar7 - IRT_INT) {
          TVar9 = lj_ir_kint64(J,8);
          (J->fold).ins.field_0.ot = 0x2809;
          (J->fold).ins.field_0.op1 = IVar20;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
          sp = lj_opt_fold(J);
          goto LAB_00137a85;
        }
        if (uVar10 == 5) {
          ct = (CType *)((long)&pCVar14->info + (ulong)((uVar17 & 0xffff) << 4));
        }
        (J->fold).ins.field_0.ot = uVar2 | 0x4300;
        (J->fold).ins.field_0.op1 = IVar20;
        (J->fold).ins.field_0.op2 = 0xe;
      }
LAB_00137ab9:
      sp = lj_opt_fold(J);
    }
  }
  uVar17 = d->info;
  if ((uVar17 & 0xf0000000) == 0x50000000) {
    uVar12 = (ulong)((uVar17 & 0xffff) << 4);
    d = (CType *)((long)&pCVar19->tab->info + uVar12);
    uVar17 = *(uint *)((long)&pCVar19->tab->info + uVar12);
  }
  pCVar19 = (CTState *)(ulong)J[-1].bpropcache[9].mode;
  IVar6 = crec_ct2irt(pCVar19,d);
  IVar7 = crec_ct2irt(pCVar19,ct);
  if ((0x3fffffff < uVar17) || (uVar10 = ct->info, 0x3fffffff < uVar10))
  goto switchD_00136fbc_caseD_3;
  k = d->size;
  bVar3 = ((byte)(0xf436fff5fff7f021 >> ((byte)(uVar10 >> 0x18) & 0x3c)) & 0xf) +
          ((byte)(0xf436fff5fff7f021 >> ((byte)(uVar17 >> 0x18) & 0x3c)) & 0xf) * '\b';
  if (0x36 < bVar3) {
    if (bVar3 != 0x3f) goto switchD_00136fbc_caseD_3;
switchD_00136fbc_caseD_36:
    if (dp == 0) goto switchD_00136fbc_caseD_3;
    TVar9 = lj_ir_kint(J,k);
    crec_copy(J,dp,sp,TVar9,d);
    goto LAB_001374f2;
  }
  uVar17 = ct->size;
  IVar18 = (IRRef1)sp;
  uVar16 = (ushort)IVar7;
  IVar20 = (IRRef1)dp;
  uVar2 = (ushort)IVar6;
  switch(bVar3) {
  case 0:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    break;
  case 1:
  case 2:
    if (IVar7 == IRT_CDATA) goto switchD_00136fbc_caseD_3;
    if (IVar7 - IRT_FLOAT < 2) {
      pcVar13 = lj_ir_k64_find(J,0);
      op = IR_KNUM;
LAB_00137529:
      TVar9 = lj_ir_k64(J,op,pcVar13);
      IVar5 = (IRRef1)TVar9;
    }
    else {
      if (IVar7 - IRT_I64 < 2) {
        pcVar13 = lj_ir_k64_find(J,0);
        op = IR_KINT64;
        goto LAB_00137529;
      }
      TVar9 = lj_ir_kint(J,0);
      IVar5 = (IRRef1)TVar9;
    }
    uVar4 = 0x800;
    k_00 = 0;
    iVar21 = 0;
    if (local_50 == (double *)0x0) goto LAB_001375af;
    if (local_50 == (double *)0x1) {
LAB_001375a4:
      uVar4 = 0x900;
      k_00 = 1;
    }
    else {
      CVar1 = ct->size;
      if ((ct->info & 0x4000000) == 0) {
        if (CVar1 == 4) {
          k_00 = iVar21;
          if (*(float *)local_50 != 0.0) goto LAB_001375a4;
        }
        else if (CVar1 == 2) {
          k_00 = iVar21;
          if (*(short *)local_50 != 0) goto LAB_001375a4;
        }
        else if (CVar1 == 1) {
          if (*(char *)local_50 != '\0') goto LAB_001375a4;
        }
        else if (*local_50 != 0.0) goto LAB_001375a4;
      }
      else {
        if (CVar1 == 4) {
          bVar22 = NAN(*(float *)local_50);
          bVar23 = *(float *)local_50 == 0.0;
        }
        else {
          bVar22 = NAN(*local_50);
          bVar23 = *local_50 == 0.0;
        }
        if ((!bVar23) || (k_00 = iVar21, bVar22)) goto LAB_001375a4;
      }
    }
LAB_001375af:
    (J->fold).ins.field_0.ot = uVar4 | uVar16 | 0x80;
    (J->fold).ins.field_0.op1 = IVar18;
    (J->fold).ins.field_0.op2 = IVar5;
    lj_opt_fold(J);
    sp = lj_ir_kint(J,k_00);
    break;
  default:
    goto switchD_00136fbc_caseD_3;
  case 8:
  case 9:
switchD_00136fbc_caseD_8:
    if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) goto switchD_00136fbc_caseD_3;
    if ((k == 8) && ((uVar17 < 8 && ((uVar10 & 0x800000) == 0)))) {
      uVar4 = uVar2 | 0x5500;
      if (uVar17 < 4) {
        IVar7 = IRT_INT;
      }
      uVar16 = (ushort)(IVar6 << 5) | (ushort)IVar7 | 0x800;
      goto LAB_00137426;
    }
    if ((7 < k) || (uVar17 != 8)) {
      if (IVar7 == IRT_INT) {
        sp = lj_opt_narrow_toint(J,sp);
      }
      break;
    }
    IVar8 = IRT_INT;
    if (3 < k) {
      IVar8 = IVar6;
    }
    uVar16 = (ushort)IVar7 | (ushort)(IVar8 << 5);
    (J->fold).ins.field_0.ot = (ushort)IVar8 | 0x5500;
    goto LAB_001374a9;
  case 10:
    goto switchD_00136fbc_caseD_a;
  case 0xb:
    (J->fold).ins.field_0.ot = uVar16 | 0x4400;
    (J->fold).ins.field_0.op1 = IVar18;
    (J->fold).ins.field_0.op2 = 0;
    sp = lj_opt_fold(J);
    goto switchD_00136fbc_caseD_a;
  case 0xd:
  case 0xe:
    if ((k & 8) == 0) {
      IVar7 = IRT_U64;
      uVar10 = 0x800000;
      uVar17 = 8;
      goto switchD_00136fbc_caseD_8;
    }
    uVar4 = uVar2 | 0x5500;
    uVar16 = (ushort)(IVar6 << 5) | 9;
    goto LAB_00137426;
  case 0x10:
  case 0x11:
    goto switchD_00136fbc_caseD_10;
  case 0x12:
    goto switchD_00136fbc_caseD_12;
  case 0x13:
    (J->fold).ins.field_0.ot = uVar16 | 0x4400;
    (J->fold).ins.field_0.op1 = IVar18;
    (J->fold).ins.field_0.op2 = 0;
    sp = lj_opt_fold(J);
switchD_00136fbc_caseD_12:
    if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) goto switchD_00136fbc_caseD_3;
    if (IVar6 == IVar7) break;
    uVar16 = uVar16 | (ushort)(IVar6 << 5);
    (J->fold).ins.field_0.ot = uVar2 | 0x5500;
LAB_001374a9:
    (J->fold).ins.field_0.op1 = (IRRef1)sp;
    (J->fold).ins.field_0.op2 = uVar16;
    goto LAB_001374b8;
  case 0x19:
  case 0x1a:
    pcVar13 = lj_ir_k64_find(J,(ulong)(k >> 1));
    TVar9 = lj_ir_k64(J,IR_KINT64,pcVar13);
    (J->fold).ins.field_0.ot = 0x2809;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    TVar9 = lj_opt_fold(J);
    pcVar13 = lj_ir_k64_find(J,0);
    TVar11 = lj_ir_k64(J,IR_KNUM,pcVar13);
    (J->fold).ins.field_0.ot = uVar2 | 0x4b00;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
    lj_opt_fold(J);
    if ((uVar10 >> 0x1a & 1) != 0) goto switchD_00136fbc_caseD_12;
switchD_00136fbc_caseD_10:
    if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) goto switchD_00136fbc_caseD_3;
    uVar4 = uVar2 | 0x5500;
    if (uVar17 < 4) {
      IVar7 = IRT_INT;
    }
    uVar16 = (ushort)(IVar6 << 5) | (ushort)IVar7;
    goto LAB_00137426;
  case 0x1b:
    if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) goto switchD_00136fbc_caseD_3;
    (J->fold).ins.field_0.ot = uVar16 | 0x4400;
    (J->fold).ins.field_0.op1 = IVar18;
    (J->fold).ins.field_0.op2 = 0;
    TVar9 = lj_opt_fold(J);
    IVar5 = (IRRef1)TVar9;
    pcVar13 = lj_ir_k64_find(J,(ulong)(uVar17 >> 1));
    TVar9 = lj_ir_k64(J,IR_KINT64,pcVar13);
    (J->fold).ins.field_0.ot = 0x2809;
    (J->fold).ins.field_0.op1 = IVar18;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    TVar9 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = uVar16 | 0x4400;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = 0;
    TVar9 = lj_opt_fold(J);
    IVar18 = (IRRef1)TVar9;
    if (IVar6 != IVar7) {
      uVar16 = uVar16 | (ushort)(IVar6 << 5);
      (J->fold).ins.field_0.ot = uVar2 | 0x5500;
      (J->fold).ins.field_0.op1 = IVar5;
      (J->fold).ins.field_0.op2 = uVar16;
      TVar9 = lj_opt_fold(J);
      IVar5 = (IRRef1)TVar9;
      (J->fold).ins.field_0.ot = uVar2 | 0x5500;
      (J->fold).ins.field_0.op1 = IVar18;
      (J->fold).ins.field_0.op2 = uVar16;
      TVar9 = lj_opt_fold(J);
      IVar18 = (IRRef1)TVar9;
    }
    (J->fold).ins.field_0.ot = uVar2 | 0x4b00;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = IVar5;
    lj_opt_fold(J);
    pcVar13 = lj_ir_k64_find(J,(ulong)(k >> 1));
    TVar9 = lj_ir_k64(J,IR_KINT64,pcVar13);
    (J->fold).ins.field_0.ot = 0x2809;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    TVar9 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = uVar2 | 0x4b00;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = IVar18;
    goto LAB_001374ed;
  case 0x29:
    if (IVar7 == IRT_CDATA) goto switchD_00136fbc_caseD_3;
    break;
  case 0x2a:
    if (IVar7 == IRT_CDATA) goto switchD_00136fbc_caseD_3;
    uVar4 = k == 8 | 0x5514;
    uVar16 = (ushort)(k == 8) << 5 | uVar16 | 0x1680;
LAB_00137426:
    (J->fold).ins.field_0.ot = uVar4;
    (J->fold).ins.field_0.op1 = IVar18;
    (J->fold).ins.field_0.op2 = uVar16;
LAB_001374b8:
    sp = lj_opt_fold(J);
    break;
  case 0x36:
    goto switchD_00136fbc_caseD_36;
  }
  if (dp != 0) {
    (J->fold).ins.field_0.ot = uVar2 | 0x4b00;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = (IRRef1)sp;
LAB_001374ed:
    lj_opt_fold(J);
LAB_001374f2:
    sp = 0;
  }
  return sp;
switchD_00136fbc_caseD_a:
  if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) {
switchD_00136fbc_caseD_3:
    lj_trace_err(J,LJ_TRERR_NYICONV);
  }
  IVar7 = IRT_INT;
  if (3 < k) {
    IVar7 = IVar6;
  }
  (J->fold).ins.field_0.ot = (ushort)IVar7 | 0x5500;
  (J->fold).ins.field_0.op1 = (IRRef1)sp;
  (J->fold).ins.field_0.op2 = (ushort)(IVar7 << 5) | uVar16 | 0x1400;
  goto LAB_001374b8;
}

Assistant:

static TRef crec_ct_tv(jit_State *J, CType *d, TRef dp, TRef sp, cTValue *sval)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID sid = CTID_P_VOID;
  void *svisnz = 0;
  CType *s;
  if (LJ_LIKELY(tref_isinteger(sp))) {
    sid = CTID_INT32;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isnum(sp)) {
    sid = CTID_DOUBLE;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isbool(sp)) {
    sp = lj_ir_kint(J, tref_istrue(sp) ? 1 : 0);
    sid = CTID_BOOL;
  } else if (tref_isnil(sp)) {
    sp = lj_ir_kptr(J, NULL);
  } else if (tref_isudata(sp)) {
    GCudata *ud = udataV(sval);
    if (ud->udtype == UDTYPE_IO_FILE) {
      TRef tr = emitir(IRT(IR_FLOAD, IRT_U8), sp, IRFL_UDATA_UDTYPE);
      emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, UDTYPE_IO_FILE));
      sp = emitir(IRT(IR_FLOAD, IRT_PTR), sp, IRFL_UDATA_FILE);
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCudata)));
    }
  } else if (tref_isstr(sp)) {
    if (ctype_isenum(d->info)) {  /* Match string against enum constant. */
      GCstr *str = strV(sval);
      CTSize ofs;
      CType *cct = lj_ctype_getfield(cts, d, str, &ofs);
      /* Specialize to the name of the enum constant. */
      emitir(IRTG(IR_EQ, IRT_STR), sp, lj_ir_kstr(J, str));
      if (cct && ctype_isconstval(cct->info)) {
	lua_assert(ctype_child(cts, cct)->size == 4);
	svisnz = (void *)(intptr_t)(ofs != 0);
	sp = lj_ir_kint(J, (int32_t)ofs);
	sid = ctype_cid(cct->info);
      }  /* else: interpreter will throw. */
    } else if (ctype_isrefarray(d->info)) {  /* Copy string to array. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);  /* NYI */
    } else {  /* Otherwise pass the string data as a const char[]. */
      /* Don't use STRREF. It folds with SNEW, which loses the trailing NUL. */
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCstr)));
      sid = CTID_A_CCHAR;
    }
  } else {  /* NYI: tref_istab(sp), tref_islightud(sp). */
    IRType t;
    sid = argv2cdata(J, sp, sval)->ctypeid;
    s = ctype_raw(cts, sid);
    svisnz = cdataptr(cdataV(sval));
    t = crec_ct2irt(cts, s);
    if (ctype_isptr(s->info)) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_PTR);
      if (ctype_isref(s->info)) {
	svisnz = *(void **)svisnz;
	s = ctype_rawchild(cts, s);
	if (ctype_isenum(s->info)) s = ctype_child(cts, s);
	t = crec_ct2irt(cts, s);
      } else {
	goto doconv;
      }
    } else if (t == IRT_I64 || t == IRT_U64) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT64);
      lj_needsplit(J);
      goto doconv;
    } else if (t == IRT_INT || t == IRT_U32) {
      if (ctype_isenum(s->info)) s = ctype_child(cts, s);
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT);
      goto doconv;
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCcdata)));
    }
    if (ctype_isnum(s->info) && t != IRT_CDATA)
      sp = emitir(IRT(IR_XLOAD, t), sp, 0);  /* Load number value. */
    goto doconv;
  }
  s = ctype_get(cts, sid);
doconv:
  if (ctype_isenum(d->info)) d = ctype_child(cts, d);
  return crec_ct_ct(J, d, s, dp, sp, svisnz);
}